

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::ByteSizeLong(Value_ImmediateValue *this)

{
  bool bVar1;
  ValueCase VVar2;
  int size;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  Value_ImmediateValue *this_local;
  
  _cached_size = 0;
  VVar2 = value_case(this);
  switch(VVar2) {
  case VALUE_NOT_SET:
    break;
  case kTensor:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TensorValue>((this->value_).tensor_);
    _cached_size = _cached_size + 1;
    break;
  case kTuple:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::TupleValue>((this->value_).tuple_);
    _cached_size = _cached_size + 1;
    break;
  case kList:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::ListValue>((this->value_).list_);
    _cached_size = _cached_size + 1;
    break;
  case kDictionary:
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::DictionaryValue>
                             ((this->value_).dictionary_);
    _cached_size = _cached_size + 1;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t Value_ImmediateValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (value_case()) {
    // .CoreML.Specification.MILSpec.TensorValue tensor = 1;
    case kTensor: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.tensor_);
      break;
    }
    // .CoreML.Specification.MILSpec.TupleValue tuple = 2;
    case kTuple: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.tuple_);
      break;
    }
    // .CoreML.Specification.MILSpec.ListValue list = 3;
    case kList: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.list_);
      break;
    }
    // .CoreML.Specification.MILSpec.DictionaryValue dictionary = 4;
    case kDictionary: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *value_.dictionary_);
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}